

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::SolverParameter::SolverParameter(SolverParameter *this,SolverParameter *from)

{
  int iVar1;
  void *pvVar2;
  string *psVar3;
  NetParameter *pNVar4;
  NetState *this_00;
  long lVar5;
  int32 *piVar6;
  int32 *piVar7;
  byte bVar8;
  
  bVar8 = 0;
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__SolverParameter_0071c610;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  *(undefined8 *)(this->_has_bits_).has_bits_ = *(undefined8 *)(from->_has_bits_).has_bits_;
  (this->test_net_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->test_net_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->test_net_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->test_net_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->test_net_).super_RepeatedPtrFieldBase,
             &(from->test_net_).super_RepeatedPtrFieldBase);
  (this->test_iter_).current_size_ = 0;
  (this->test_iter_).total_size_ = 0;
  (this->test_iter_).rep_ = (Rep *)0x0;
  iVar1 = (from->test_iter_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<int>::Reserve(&this->test_iter_,iVar1);
    memcpy(((this->test_iter_).rep_)->elements,((from->test_iter_).rep_)->elements,
           (long)(from->test_iter_).current_size_ << 2);
    (this->test_iter_).current_size_ = (from->test_iter_).current_size_;
  }
  (this->test_net_param_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->test_net_param_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetParameter>::TypeHandler>
            (&(this->test_net_param_).super_RepeatedPtrFieldBase,
             &(from->test_net_param_).super_RepeatedPtrFieldBase);
  (this->test_state_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->test_state_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->test_state_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->test_state_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<caffe::NetState>::TypeHandler>
            (&(this->test_state_).super_RepeatedPtrFieldBase,
             &(from->test_state_).super_RepeatedPtrFieldBase);
  (this->stepvalue_).current_size_ = 0;
  (this->stepvalue_).total_size_ = 0;
  (this->stepvalue_).rep_ = (Rep *)0x0;
  iVar1 = (from->stepvalue_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<int>::Reserve(&this->stepvalue_,iVar1);
    memcpy(((this->stepvalue_).rep_)->elements,((from->stepvalue_).rep_)->elements,
           (long)(from->stepvalue_).current_size_ << 2);
    (this->stepvalue_).current_size_ = (from->stepvalue_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->train_net_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (psVar3 = (from->train_net_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->train_net_,psVar3);
  }
  (this->lr_policy_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 2) != 0) &&
     (psVar3 = (from->lr_policy_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->lr_policy_,psVar3);
  }
  (this->snapshot_prefix_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 4) != 0) &&
     (psVar3 = (from->snapshot_prefix_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->snapshot_prefix_,psVar3);
  }
  (this->net_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 8) != 0) &&
     (psVar3 = (from->net_).ptr_,
     psVar3 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->net_,psVar3);
  }
  (this->regularization_type_).ptr_ = (string *)&_default_regularization_type__abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 0x10) != 0) &&
     (psVar3 = (from->regularization_type_).ptr_,
     psVar3 != (string *)&_default_regularization_type__abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->regularization_type_,psVar3);
  }
  (this->type_).ptr_ = (string *)&_default_type__abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 0x20) != 0) &&
     (psVar3 = (from->type_).ptr_, psVar3 != (string *)&_default_type__abi_cxx11_)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->type_,psVar3);
  }
  if (((from->_has_bits_).has_bits_[0] & 0x40) == 0) {
    pNVar4 = (NetParameter *)0x0;
  }
  else {
    pNVar4 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(pNVar4,from->train_net_param_);
  }
  this->train_net_param_ = pNVar4;
  if (((from->_has_bits_).has_bits_[0] & 0x80) == 0) {
    pNVar4 = (NetParameter *)0x0;
  }
  else {
    pNVar4 = (NetParameter *)operator_new(0xa0);
    NetParameter::NetParameter(pNVar4,from->net_param_);
  }
  this->net_param_ = pNVar4;
  if (((from->_has_bits_).has_bits_[0] & 0x100) == 0) {
    this_00 = (NetState *)0x0;
  }
  else {
    this_00 = (NetState *)operator_new(0x38);
    NetState::NetState(this_00,from->train_state_);
  }
  this->train_state_ = this_00;
  piVar6 = &from->test_interval_;
  piVar7 = &this->test_interval_;
  for (lVar5 = 0xc; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)piVar7 = *(undefined8 *)piVar6;
    piVar6 = piVar6 + (ulong)bVar8 * -4 + 2;
    piVar7 = piVar7 + (ulong)bVar8 * -4 + 2;
  }
  return;
}

Assistant:

SolverParameter::SolverParameter(const SolverParameter& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      test_net_(from.test_net_),
      test_iter_(from.test_iter_),
      test_net_param_(from.test_net_param_),
      test_state_(from.test_state_),
      stepvalue_(from.stepvalue_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  train_net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_train_net()) {
    train_net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.train_net_);
  }
  lr_policy_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_lr_policy()) {
    lr_policy_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.lr_policy_);
  }
  snapshot_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_snapshot_prefix()) {
    snapshot_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.snapshot_prefix_);
  }
  net_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_net()) {
    net_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.net_);
  }
  regularization_type_.UnsafeSetDefault(&SolverParameter::_default_regularization_type_.get());
  if (from.has_regularization_type()) {
    regularization_type_.AssignWithDefault(&SolverParameter::_default_regularization_type_.get(), from.regularization_type_);
  }
  type_.UnsafeSetDefault(&SolverParameter::_default_type_.get());
  if (from.has_type()) {
    type_.AssignWithDefault(&SolverParameter::_default_type_.get(), from.type_);
  }
  if (from.has_train_net_param()) {
    train_net_param_ = new ::caffe::NetParameter(*from.train_net_param_);
  } else {
    train_net_param_ = NULL;
  }
  if (from.has_net_param()) {
    net_param_ = new ::caffe::NetParameter(*from.net_param_);
  } else {
    net_param_ = NULL;
  }
  if (from.has_train_state()) {
    train_state_ = new ::caffe::NetState(*from.train_state_);
  } else {
    train_state_ = NULL;
  }
  ::memcpy(&test_interval_, &from.test_interval_,
    reinterpret_cast<char*>(&rms_decay_) -
    reinterpret_cast<char*>(&test_interval_) + sizeof(rms_decay_));
  // @@protoc_insertion_point(copy_constructor:caffe.SolverParameter)
}